

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsd.c
# Opt level: O2

void tsd_force_recompute(tsdn_t *tsdn)

{
  tsd_list_t tVar1;
  malloc_mutex_t *in_RSI;
  
  malloc_mutex_lock(tsdn,in_RSI);
  tVar1 = tsd_nominal_tsds;
  while (tVar1.qlh_first != (tsd_t *)0x0) {
    ((tVar1.qlh_first)->state).repr = '\x02';
    (tVar1.qlh_first)->
    cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event_fast = 0;
    (tVar1.qlh_first)->
    cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event_fast = 0;
    tVar1.qlh_first =
         ((tVar1.qlh_first)->cant_access_tsd_items_directly_use_a_getter_or_setter_tsd_link).
         qre_next;
    if (tVar1.qlh_first == tsd_nominal_tsds.qlh_first) {
      tVar1.qlh_first = (tsd_t *)0x0;
    }
  }
  tsd_nominal_tsds_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&tsd_nominal_tsds_lock.field_0 + 0x48));
  return;
}

Assistant:

static void
tsd_force_recompute(tsdn_t *tsdn) {
	/*
	 * The stores to tsd->state here need to synchronize with the exchange
	 * in tsd_slow_update.
	 */
	atomic_fence(ATOMIC_RELEASE);
	malloc_mutex_lock(tsdn, &tsd_nominal_tsds_lock);
	tsd_t *remote_tsd;
	ql_foreach(remote_tsd, &tsd_nominal_tsds, TSD_MANGLE(tsd_link)) {
		assert(tsd_atomic_load(&remote_tsd->state, ATOMIC_RELAXED)
		    <= tsd_state_nominal_max);
		tsd_atomic_store(&remote_tsd->state,
		    tsd_state_nominal_recompute, ATOMIC_RELAXED);
		/* See comments in te_recompute_fast_threshold(). */
		atomic_fence(ATOMIC_SEQ_CST);
		te_next_event_fast_set_non_nominal(remote_tsd);
	}
	malloc_mutex_unlock(tsdn, &tsd_nominal_tsds_lock);
}